

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  randomx_flags rVar1;
  randomx_flags rVar2;
  int iVar3;
  ostream *poVar4;
  code *pcVar5;
  randomx_argon2_impl *prVar6;
  unsigned_long uVar7;
  ulong uVar8;
  runtime_error *prVar9;
  undefined8 *puVar10;
  char *pcVar11;
  uint uVar12;
  pointer_____offset_0x10___ *ppuVar13;
  char *pcVar14;
  undefined **ppuVar15;
  int i;
  int iVar16;
  double dVar17;
  bool miningMode;
  bool largePages;
  bool commit;
  bool noBatch;
  bool autoFlags;
  bool avx2;
  bool ssse3;
  bool secure;
  bool jit;
  bool verificationMode;
  bool softAes;
  uint32_t count;
  int noncesCount;
  int initThreadCount;
  int threadCount;
  bool help;
  randomx_cache *cache;
  randomx_vm *vm;
  MineFunc *func;
  int cpuid;
  atomic<unsigned_int> atomicNonce;
  int32_t seedValue;
  uint32_t startItem;
  undefined4 uStack_dc;
  randomx_dataset *dataset;
  reference_wrapper<std::atomic<unsigned_int>_> local_d0;
  uint64_t threadAffinity;
  char seed [4];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> vms;
  Stopwatch sw;
  AtomicHash result;
  
  readOption("--softAes",argc,argv,&softAes);
  readOption("--mine",argc,argv,&miningMode);
  readOption("--verify",argc,argv,&verificationMode);
  readIntOption("--threads",argc,argv,&threadCount,1);
  readUInt64Option("--affinity",argc,argv,&threadAffinity,0);
  readIntOption("--nonces",argc,argv,&noncesCount,1000);
  readIntOption("--init",argc,argv,&initThreadCount,1);
  readIntOption("--seed",argc,argv,&seedValue,0);
  readOption("--largePages",argc,argv,&largePages);
  if (largePages == false) {
    readOption("--largepages",argc,argv,&largePages);
  }
  readOption("--jit",argc,argv,&jit);
  readOption("--help",argc,argv,&help);
  readOption("--secure",argc,argv,&secure);
  readOption("--ssse3",argc,argv,&ssse3);
  readOption("--avx2",argc,argv,&avx2);
  readOption("--auto",argc,argv,&autoFlags);
  readOption("--noBatch",argc,argv,&noBatch);
  readOption("--commit",argc,argv,&commit);
  seed[0] = (undefined1)seedValue;
  seed[1] = seedValue._1_1_;
  seed[2] = seedValue._2_1_;
  seed[3] = seedValue._3_1_;
  poVar4 = std::operator<<((ostream *)&std::cout,"RandomX benchmark v1.2.1");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (help == true) {
    printUsage(*argv);
    return 0;
  }
  if ((miningMode == false) && (verificationMode == false)) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Please select either the fast mode (--mine) or the slow mode (--verify)"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"Run \'");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," --help\' to see all supported options");
    std::endl<char,std::char_traits<char>>(poVar4);
    return 0;
  }
  atomicNonce.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
  AtomicHash::AtomicHash(&result);
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (autoFlags == true) {
    initThreadCount = std::thread::hardware_concurrency();
    rVar1 = randomx_get_flags();
  }
  else {
    rVar1 = (uint)ssse3 * 0x20 + RANDOMX_FLAG_ARGON2_AVX2;
    if (avx2 == false) {
      rVar1 = (uint)ssse3 * 0x20;
    }
    rVar2 = rVar1 + RANDOMX_FLAG_HARD_AES;
    if (softAes != false) {
      rVar2 = rVar1;
    }
    rVar1 = rVar2 + RANDOMX_FLAG_JIT;
    if (jit == false) {
      rVar1 = rVar2;
    }
  }
  rVar2 = largePages | rVar1 | RANDOMX_FLAG_FULL_MEM;
  if (miningMode == false) {
    rVar2 = largePages | rVar1;
  }
  rVar1 = rVar2 | RANDOMX_FLAG_SECURE;
  if (secure == false) {
    rVar1 = rVar2;
  }
  pcVar11 = " - Argon2 implementation: SSSE3";
  if ((rVar1 & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT) {
    pcVar11 = " - Argon2 implementation: reference";
  }
  pcVar14 = " - Argon2 implementation: AVX2";
  if ((rVar1 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    pcVar14 = pcVar11;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar11 = " - full memory mode (2080 MiB)";
  if ((rVar1 & RANDOMX_FLAG_FULL_MEM) == RANDOMX_FLAG_DEFAULT) {
    pcVar11 = " - light memory mode (256 MiB)";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar4);
  if ((rVar1 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    poVar4 = std::operator<<((ostream *)&std::cout," - interpreted mode");
  }
  else {
    poVar4 = (ostream *)&std::cout;
    std::operator<<((ostream *)&std::cout," - JIT compiled mode ");
    if ((rVar1 & RANDOMX_FLAG_SECURE) != RANDOMX_FLAG_DEFAULT) {
      poVar4 = (ostream *)&std::cout;
      std::operator<<((ostream *)&std::cout,"(secure)");
    }
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar11 = " - hardware AES mode";
  if ((rVar1 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
    pcVar11 = " - software AES mode";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar11 = " - large pages mode";
  if ((rVar1 & RANDOMX_FLAG_LARGE_PAGES) == RANDOMX_FLAG_DEFAULT) {
    pcVar11 = " - small pages mode";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (threadAffinity != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout," - thread affinity (");
    mask_to_string_abi_cxx11_((string *)&sw,threadAffinity);
    poVar4 = std::operator<<(poVar4,(string *)&sw);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&sw);
  }
  if (noBatch == true) {
    if (commit == false) {
      pcVar5 = mine<false,false>;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout," - hash commitments");
      std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010749c:
      pcVar5 = mine<false,true>;
    }
  }
  else {
    if (commit != false) {
      poVar4 = std::operator<<((ostream *)&std::cout," - hash commitments");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_0010749c;
    }
    poVar4 = std::operator<<((ostream *)&std::cout," - batch mode");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar5 = mine<true,false>;
  }
  func = pcVar5;
  std::operator<<((ostream *)&std::cout,"Initializing");
  if (miningMode == true) {
    poVar4 = std::operator<<((ostream *)&std::cout," (");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,initThreadCount);
    poVar4 = std::operator<<(poVar4," thread");
    pcVar11 = ")";
    if (1 < initThreadCount) {
      pcVar11 = "s)";
    }
    std::operator<<(poVar4,pcVar11);
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ...");
  std::endl<char,std::char_traits<char>>(poVar4);
  prVar6 = randomx::selectArgonImpl(rVar1);
  if (prVar6 == (randomx_argon2_impl *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"Unsupported Argon2 implementation");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((rVar1 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "WARNING: You are using the interpreter mode. Use --jit for optimal performance."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  sw.startMark.__d.__r = (duration)0;
  sw.elapsed = 0;
  sw.isRunning = false;
  sw.startMark.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  sw.isRunning = true;
  cache = randomx_alloc_cache(rVar1);
  if (cache == (randomx_cache *)0x0) {
    ppuVar13 = &CacheAllocException::typeinfo;
    ppuVar15 = &PTR__exception_0011eef8;
LAB_00107bb6:
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = ppuVar15;
    __cxa_throw(puVar10,ppuVar13,std::exception::~exception);
  }
  randomx_init_cache(cache,seed,4);
  if (miningMode == true) {
    dataset = randomx_alloc_dataset(rVar1);
    if (dataset == (randomx_dataset *)0x0) {
      ppuVar13 = &DatasetAllocException::typeinfo;
      ppuVar15 = &PTR__exception_0011ef20;
      dataset = (randomx_dataset *)0x0;
      goto LAB_00107bb6;
    }
    uVar7 = randomx_dataset_item_count();
    if (initThreadCount < 2) {
      randomx_init_dataset(dataset,cache,0,uVar7 & 0xffffffff);
    }
    else {
      uVar8 = (ulong)(uint)initThreadCount;
      _startItem = (AtomicHash *)((ulong)_startItem & 0xffffffff00000000);
      for (iVar16 = 0; iVar16 < initThreadCount; iVar16 = iVar16 + 1) {
        iVar3 = 0;
        if (iVar16 == initThreadCount + -1) {
          iVar3 = (int)((uVar7 & 0xffffffff) % uVar8);
        }
        count = iVar3 + (int)((uVar7 & 0xffffffff) / uVar8);
        local_d0._M_data = (atomic<unsigned_int> *)randomx_init_dataset;
        std::thread::
        thread<void(*)(randomx_dataset*,randomx_cache*,unsigned_long,unsigned_long),randomx_dataset*&,randomx_cache*&,unsigned_int&,unsigned_int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_dataset_ptr_randomx_cache_ptr_unsigned_long_unsigned_long **)
                   &local_d0,&dataset,&cache,&startItem,&count);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        std::thread::~thread((thread *)&vm);
        startItem = startItem + count;
      }
      for (uVar12 = 0;
          (ulong)uVar12 <
          (ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
        std::thread::join();
      }
    }
    randomx_release_cache(cache);
    cache = (randomx_cache *)0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(&threads);
  }
  std::operator<<((ostream *)&std::cout,"Memory initialized in ");
  dVar17 = Stopwatch::getElapsed(&sw);
  poVar4 = std::ostream::_M_insert<double>(dVar17);
  poVar4 = std::operator<<(poVar4," s");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Initializing ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,threadCount);
  poVar4 = std::operator<<(poVar4," virtual machine(s) ...");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (iVar16 = 0; iVar16 < threadCount; iVar16 = iVar16 + 1) {
    vm = randomx_create_vm(rVar1,cache,dataset);
    if (vm == (randomx_vm *)0x0) {
      if ((rVar1 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        if (largePages == true) {
          std::runtime_error::runtime_error
                    (prVar9,"Cannot create VM with the selected options. Try without --largePages");
        }
        else {
          std::runtime_error::runtime_error(prVar9,"Cannot create VM");
        }
      }
      else {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar9,"Cannot create VM with the selected options. Try using --softAes");
      }
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::push_back(&vms,&vm);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Running benchmark (");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,noncesCount);
  poVar4 = std::operator<<(poVar4," nonces) ...");
  std::endl<char,std::char_traits<char>>(poVar4);
  sw.startMark.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  sw.isRunning = true;
  sw.elapsed = 0;
  if (threadCount < 2) {
    (*func)(*vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
             super__Vector_impl_data._M_start,&atomicNonce,&result,noncesCount,0,-1);
  }
  else {
    for (count = 0; uVar8 = (ulong)count,
        uVar8 < (ulong)((long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); count = count + 1) {
      cpuid = -1;
      if (threadAffinity != 0) {
        cpuid = cpuid_from_mask(threadAffinity,&count);
        uVar8 = (ulong)count;
      }
      local_d0._M_data = &atomicNonce;
      _startItem = &result;
      std::thread::
      thread<void(*&)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*&,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int&,unsigned_int&,int&,void>
                ((thread *)&vm,
                 (_func_void_randomx_vm_ptr_atomic<unsigned_int>_ptr_AtomicHash_ptr_uint_int_int **)
                 &func,vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar8,&local_d0,
                 (reference_wrapper<AtomicHash> *)&startItem,&noncesCount,&count,&cpuid);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&threads,(thread *)&vm);
      std::thread::~thread((thread *)&vm);
    }
    for (uVar12 = 0;
        (ulong)uVar12 <
        (ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
      std::thread::join();
    }
  }
  dVar17 = Stopwatch::getElapsed(&sw);
  for (uVar12 = 0;
      (ulong)uVar12 <
      (ulong)((long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
    randomx_destroy_vm(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12]);
  }
  if (miningMode == false) {
    randomx_release_cache(cache);
  }
  else {
    randomx_release_dataset(dataset);
  }
  std::operator<<((ostream *)&std::cout,"Calculated result: ");
  AtomicHash::print(&result,(ostream *)&std::cout);
  if (noncesCount == 1000 && seedValue == 0) {
    if (commit != false) goto LAB_00107a1b;
    pcVar11 = "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987";
  }
  else {
    if ((noncesCount != 10 || seedValue != 0) || (commit != false)) goto LAB_00107a1b;
    pcVar11 = "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_00107a1b:
  if (miningMode == false) {
    std::operator<<((ostream *)&std::cout,"Performance: ");
    poVar4 = std::ostream::_M_insert<double>((dVar17 * 1000.0) / (double)noncesCount);
    pcVar11 = " ms per hash";
  }
  else {
    std::operator<<((ostream *)&std::cout,"Performance: ");
    poVar4 = std::ostream::_M_insert<double>((double)noncesCount / dVar17);
    pcVar11 = " hashes per second";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  std::_Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>::~_Vector_base
            (&vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, miningMode, verificationMode, help, largePages, jit, secure, commit;
	bool ssse3, avx2, autoFlags, noBatch;
	int noncesCount, threadCount, initThreadCount;
	uint64_t threadAffinity;
	int32_t seedValue;
	char seed[4];

	readOption("--softAes", argc, argv, softAes);
	readOption("--mine", argc, argv, miningMode);
	readOption("--verify", argc, argv, verificationMode);
	readIntOption("--threads", argc, argv, threadCount, 1);
	readUInt64Option("--affinity", argc, argv, threadAffinity, 0);
	readIntOption("--nonces", argc, argv, noncesCount, 1000);
	readIntOption("--init", argc, argv, initThreadCount, 1);
	readIntOption("--seed", argc, argv, seedValue, 0);
	readOption("--largePages", argc, argv, largePages);
	if (!largePages) {
		readOption("--largepages", argc, argv, largePages);
	}
	readOption("--jit", argc, argv, jit);
	readOption("--help", argc, argv, help);
	readOption("--secure", argc, argv, secure);
	readOption("--ssse3", argc, argv, ssse3);
	readOption("--avx2", argc, argv, avx2);
	readOption("--auto", argc, argv, autoFlags);
	readOption("--noBatch", argc, argv, noBatch);
	readOption("--commit", argc, argv, commit);

	store32(&seed, seedValue);

	std::cout << "RandomX benchmark v1.2.1" << std::endl;

	if (help) {
		printUsage(argv[0]);
		return 0;
	}

	if (!miningMode && !verificationMode) {
		std::cout << "Please select either the fast mode (--mine) or the slow mode (--verify)" << std::endl;
		std::cout << "Run '" << argv[0] << " --help' to see all supported options" << std::endl;
		return 0;
	}

	std::atomic<uint32_t> atomicNonce(0);
	AtomicHash result;
	std::vector<randomx_vm*> vms;
	std::vector<std::thread> threads;
	randomx_dataset* dataset;
	randomx_cache* cache;
	randomx_flags flags;

	if (autoFlags) {
		initThreadCount = std::thread::hardware_concurrency();
		flags = randomx_get_flags();
	}
	else {
		flags = RANDOMX_FLAG_DEFAULT;
		if (ssse3) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		if (avx2) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (!softAes) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (jit) {
			flags |= RANDOMX_FLAG_JIT;
#ifdef RANDOMX_FORCE_SECURE
			flags |= RANDOMX_FLAG_SECURE;
#endif
		}
	}

	if (largePages) {
		flags |= RANDOMX_FLAG_LARGE_PAGES;
	}
	if (miningMode) {
		flags |= RANDOMX_FLAG_FULL_MEM;
	}
#ifndef RANDOMX_FORCE_SECURE
	if (secure) {
		flags |= RANDOMX_FLAG_SECURE;
	}
#endif

	if (flags & RANDOMX_FLAG_ARGON2_AVX2) {
		std::cout << " - Argon2 implementation: AVX2" << std::endl;
	}
	else if (flags & RANDOMX_FLAG_ARGON2_SSSE3) {
		std::cout << " - Argon2 implementation: SSSE3" << std::endl;
	}
	else {
		std::cout << " - Argon2 implementation: reference" << std::endl;
	}

	if (flags & RANDOMX_FLAG_FULL_MEM) {
		std::cout << " - full memory mode (2080 MiB)" << std::endl;
	}
	else {
		std::cout << " - light memory mode (256 MiB)" << std::endl;
	}

	if (flags & RANDOMX_FLAG_JIT) {
		std::cout << " - JIT compiled mode ";
		if (flags & RANDOMX_FLAG_SECURE) {
			std::cout << "(secure)";
		}
		std::cout << std::endl;
	}
	else {
		std::cout << " - interpreted mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_HARD_AES) {
		std::cout << " - hardware AES mode" << std::endl;
	}
	else {
		std::cout << " - software AES mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_LARGE_PAGES) {
		std::cout << " - large pages mode" << std::endl;
	}
	else {
		std::cout << " - small pages mode" << std::endl;
	}

	if (threadAffinity) {
		std::cout << " - thread affinity (" << mask_to_string(threadAffinity) << ")" << std::endl;
	}

	MineFunc* func;

	if (noBatch) {
		if (commit) {
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			func = &mine<false, false>;
		}
	}
	else {
		if (commit) {
			//TODO: support batch mode with commitments
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			std::cout << " - batch mode" << std::endl;
			func = &mine<true, false>;
		}
	}

	std::cout << "Initializing";
	if (miningMode)
		std::cout << " (" << initThreadCount << " thread" << (initThreadCount > 1 ? "s)" : ")");
	std::cout << " ..." << std::endl;

	try {
		if (nullptr == randomx::selectArgonImpl(flags)) {
			throw std::runtime_error("Unsupported Argon2 implementation");
		}
		if ((flags & RANDOMX_FLAG_JIT) && !RANDOMX_HAVE_COMPILER) {
			throw std::runtime_error("JIT compilation is not supported on this platform. Try without --jit");
		}
		if (!(flags & RANDOMX_FLAG_JIT) && RANDOMX_HAVE_COMPILER) {
			std::cout << "WARNING: You are using the interpreter mode. Use --jit for optimal performance." << std::endl;
		}

		Stopwatch sw(true);
		cache = randomx_alloc_cache(flags);
		if (cache == nullptr) {
			throw CacheAllocException();
		}
		randomx_init_cache(cache, &seed, sizeof(seed));
		if (miningMode) {
			dataset = randomx_alloc_dataset(flags);
			if (dataset == nullptr) {
				throw DatasetAllocException();
			}
			uint32_t datasetItemCount = randomx_dataset_item_count();
			if (initThreadCount > 1) {
				auto perThread = datasetItemCount / initThreadCount;
				auto remainder = datasetItemCount % initThreadCount;
				uint32_t startItem = 0;
				for (int i = 0; i < initThreadCount; ++i) {
					auto count = perThread + (i == initThreadCount - 1 ? remainder : 0);
					threads.push_back(std::thread(&randomx_init_dataset, dataset, cache, startItem, count));
					startItem += count;
				}
				for (unsigned i = 0; i < threads.size(); ++i) {
					threads[i].join();
				}
			}
			else {
				randomx_init_dataset(dataset, cache, 0, datasetItemCount);
			}
			randomx_release_cache(cache);
			cache = nullptr;
			threads.clear();
		}
		std::cout << "Memory initialized in " << sw.getElapsed() << " s" << std::endl;
		std::cout << "Initializing " << threadCount << " virtual machine(s) ..." << std::endl;
		for (int i = 0; i < threadCount; ++i) {
			randomx_vm *vm = randomx_create_vm(flags, cache, dataset);
			if (vm == nullptr) {
				if ((flags & RANDOMX_FLAG_HARD_AES)) {
					throw std::runtime_error("Cannot create VM with the selected options. Try using --softAes");
				}
				if (largePages) {
					throw std::runtime_error("Cannot create VM with the selected options. Try without --largePages");
				}
				throw std::runtime_error("Cannot create VM");
			}
			vms.push_back(vm);
		}
		std::cout << "Running benchmark (" << noncesCount << " nonces) ..." << std::endl;
		sw.restart();
		if (threadCount > 1) {
			for (unsigned i = 0; i < vms.size(); ++i) {
				int cpuid = -1;
				if (threadAffinity)
					cpuid = cpuid_from_mask(threadAffinity, i);
				threads.push_back(std::thread(func, vms[i], std::ref(atomicNonce), std::ref(result), noncesCount, i, cpuid));
			}
			for (unsigned i = 0; i < threads.size(); ++i) {
				threads[i].join();
			}
		}
		else {
			func(vms[0], std::ref(atomicNonce), std::ref(result), noncesCount, 0, -1);
		}

		double elapsed = sw.getElapsed();
		for (unsigned i = 0; i < vms.size(); ++i)
			randomx_destroy_vm(vms[i]);
		if (miningMode)
			randomx_release_dataset(dataset);
		else
			randomx_release_cache(cache);
		std::cout << "Calculated result: ";
		result.print(std::cout);
		if (noncesCount == 1000 && seedValue == 0 && !commit)
			std::cout << "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987" << std::endl;
		else if (noncesCount == 10 && seedValue == 0 && !commit)
			std::cout << "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d" << std::endl;
		if (!miningMode) {
			std::cout << "Performance: " << 1000 * elapsed / noncesCount << " ms per hash" << std::endl;
		}
		else {
			std::cout << "Performance: " << noncesCount / elapsed << " hashes per second" << std::endl;
		}
	}
	catch (MemoryException& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		if (largePages) {
#ifdef _WIN32
			std::cout << "To use large pages, please enable the \"Lock Pages in Memory\" policy and reboot." << std::endl;
			if (!IsWindows8OrGreater()) {
				std::cout << "Additionally, you have to run the benchmark from elevated command prompt." << std::endl;
			}
#else
			std::cout << "To use large pages, please run: sudo sysctl -w vm.nr_hugepages=1250" << std::endl;
#endif
		}
		return 1;
	}
	catch (std::exception& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		return 1;
	}
	return 0;
}